

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O3

void __thiscall
TPZCompElH1<pzshape::TPZShapeLinear>::InitMaterialData
          (TPZCompElH1<pzshape::TPZShapeLinear> *this,TPZMaterialData *data)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  TPZGeoEl *pTVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  double *pdVar10;
  bool bVar11;
  int64_t newsize;
  ulong uVar12;
  ulong uVar13;
  uint64_t ducol;
  uint64_t durow;
  TPZManVector<long,_2> ids;
  TPZManVector<int,_3> orders;
  uint64_t ulen;
  undefined4 local_e0 [2];
  undefined4 local_d8 [2];
  TPZVec<int> local_d0;
  int aiStack_b0 [2];
  TPZVec<long> local_a8;
  long local_88 [2];
  TPZVec<int> local_78;
  uint local_58 [4];
  TPZGeoElSide local_48;
  
  pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
  data->gelElId = (int)pTVar5->fId;
  lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))(this);
  if (lVar6 == 0) {
    plVar7 = (long *)0x0;
  }
  else {
    plVar7 = (long *)__dynamic_cast(lVar6,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                                    0xfffffffffffffffe);
  }
  TPZVec<long>::TPZVec(&local_a8,0);
  local_a8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181b7f8;
  local_a8.fStore = local_88;
  local_a8.fNElements = 2;
  local_a8.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_78,0);
  local_78.fStore = (int *)local_58;
  local_78._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_78.fNElements = 1;
  local_78.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_d0,0);
  local_d0.fStore = aiStack_b0;
  local_d0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181c8e8;
  local_d0.fNElements = 2;
  local_d0.fNAlloc = 0;
  aiStack_b0[0] = 0;
  aiStack_b0[1] = 0;
  pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
  lVar6 = 0;
  bVar2 = true;
  do {
    bVar11 = bVar2;
    lVar8 = (**(code **)(*(long *)pTVar5 + 0xa8))(pTVar5,lVar6);
    local_a8.fStore[lVar6] = lVar8;
    lVar6 = 1;
    bVar2 = false;
  } while (bVar11);
  lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xa8))(this,2);
  *local_78.fStore = (uint)*(byte *)(lVar6 + 0x14);
  TPZShapeH1<pzshape::TPZShapeLinear>::Initialize(&local_a8,&local_78,&data->super_TPZShapeData);
  (**(code **)(*plVar7 + 0x48))(plVar7,data);
  iVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb0))(this);
  lVar6 = (data->super_TPZShapeData).fPhi.super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow;
  plVar9 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))(this);
  uVar4 = (**(code **)(*plVar9 + 0x78))(plVar9);
  (data->super_TPZShapeData).fShapeType = EScalarShape;
  uVar12 = (ulong)(int)lVar6;
  if (uVar12 != (data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fCol * (data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow) {
    pdVar1 = (data->phi).super_TPZFMatrix<double>.fElem;
    pdVar10 = (data->phi).super_TPZFMatrix<double>.fGiven;
    if (pdVar1 != pdVar10 && pdVar1 != (double *)0x0) {
      operator_delete__(pdVar1);
      pdVar10 = (data->phi).super_TPZFMatrix<double>.fGiven;
    }
    if ((pdVar10 == (double *)0x0) || ((data->phi).super_TPZFMatrix<double>.fSize < (long)uVar12)) {
      lVar6 = lVar6 << 0x20;
      if (lVar6 == 0) {
        pdVar10 = (double *)0x0;
      }
      else {
        pdVar10 = (double *)operator_new__(-(ulong)(uVar12 >> 0x3d != 0) | lVar6 >> 0x1d);
      }
    }
    (data->phi).super_TPZFMatrix<double>.fElem = pdVar10;
  }
  (data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar12;
  (data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  (*(data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->phi);
  lVar6 = (long)iVar3;
  uVar13 = uVar12 * lVar6;
  if (uVar13 - (data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
               fCol * (data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fRow != 0) {
    pdVar1 = (data->dphix).super_TPZFMatrix<double>.fElem;
    pdVar10 = (data->dphix).super_TPZFMatrix<double>.fGiven;
    if (pdVar1 != pdVar10 && pdVar1 != (double *)0x0) {
      operator_delete__(pdVar1);
      pdVar10 = (data->dphix).super_TPZFMatrix<double>.fGiven;
    }
    if ((pdVar10 == (double *)0x0) ||
       (lVar8 = (data->dphix).super_TPZFMatrix<double>.fSize,
       uVar13 - lVar8 != 0 && lVar8 <= (long)uVar13)) {
      if (uVar13 == 0) {
        pdVar10 = (double *)0x0;
      }
      else {
        pdVar10 = (double *)operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8);
      }
    }
    (data->dphix).super_TPZFMatrix<double>.fElem = pdVar10;
  }
  (data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar6;
  (data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar12;
  (*(data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->dphix);
  uVar12 = lVar6 * 3;
  if (uVar12 != (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fCol * (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow) {
    pdVar1 = (data->axes).super_TPZFMatrix<double>.fElem;
    pdVar10 = (data->axes).super_TPZFMatrix<double>.fGiven;
    if (pdVar1 != pdVar10 && pdVar1 != (double *)0x0) {
      operator_delete__(pdVar1);
      pdVar10 = (data->axes).super_TPZFMatrix<double>.fGiven;
    }
    if ((pdVar10 == (double *)0x0) || ((data->axes).super_TPZFMatrix<double>.fSize < (long)uVar12))
    {
      if (iVar3 == 0) {
        pdVar10 = (double *)0x0;
      }
      else {
        pdVar10 = (double *)operator_new__(-(ulong)(uVar12 >> 0x3d != 0) | lVar6 * 0x18);
      }
    }
    (data->axes).super_TPZFMatrix<double>.fElem = pdVar10;
  }
  (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar6;
  (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  (*(data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->axes);
  uVar12 = lVar6 * lVar6;
  if (uVar12 - (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
               .fCol * (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow != 0) {
    pdVar1 = (data->jacobian).super_TPZFMatrix<double>.fElem;
    pdVar10 = (data->jacobian).super_TPZFMatrix<double>.fGiven;
    if (pdVar1 != pdVar10 && pdVar1 != (double *)0x0) {
      operator_delete__(pdVar1);
      pdVar10 = (data->jacobian).super_TPZFMatrix<double>.fGiven;
    }
    if ((pdVar10 == (double *)0x0) ||
       (lVar8 = (data->jacobian).super_TPZFMatrix<double>.fSize,
       uVar12 - lVar8 != 0 && lVar8 <= (long)uVar12)) {
      if (iVar3 == 0) {
        pdVar10 = (double *)0x0;
      }
      else {
        pdVar10 = (double *)operator_new__(-(ulong)(uVar12 >> 0x3d != 0) | uVar12 * 8);
      }
    }
    (data->jacobian).super_TPZFMatrix<double>.fElem = pdVar10;
  }
  (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar6
  ;
  (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6
  ;
  (*(data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->jacobian);
  if (uVar12 - (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
               fCol * (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fRow != 0) {
    pdVar1 = (data->jacinv).super_TPZFMatrix<double>.fElem;
    pdVar10 = (data->jacinv).super_TPZFMatrix<double>.fGiven;
    if (pdVar1 != pdVar10 && pdVar1 != (double *)0x0) {
      operator_delete__(pdVar1);
      pdVar10 = (data->jacinv).super_TPZFMatrix<double>.fGiven;
    }
    if ((pdVar10 == (double *)0x0) ||
       (lVar8 = (data->jacinv).super_TPZFMatrix<double>.fSize,
       uVar12 - lVar8 != 0 && lVar8 <= (long)uVar12)) {
      if (iVar3 == 0) {
        pdVar10 = (double *)0x0;
      }
      else {
        pdVar10 = (double *)operator_new__(-(ulong)(uVar12 >> 0x3d != 0) | uVar12 * 8);
      }
    }
    (data->jacinv).super_TPZFMatrix<double>.fElem = pdVar10;
  }
  (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar6;
  (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6;
  (*(data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->jacinv);
  TPZManVector<double,_3>::Resize(&data->x,3);
  if (data->fNeedsSol == true) {
    (**(code **)(*plVar7 + 0x60))(plVar7,&local_48,local_d8,local_e0);
    (**(code **)(*(long *)&data->super_TPZShapeData + 0x50))
              (data,uVar4,local_48.super_TPZSavable._vptr_TPZSavable._0_4_,local_d8[0],local_e0[0]);
  }
  if (data->fNeedsNeighborCenter == true) {
    TPZGeoElSide::TPZGeoElSide(&local_48,pTVar5);
    TPZGeoElSide::CenterX(&local_48,&(data->XCenter).super_TPZVec<double>);
  }
  if (local_d0.fStore != aiStack_b0) {
    local_d0.fNAlloc = 0;
    local_d0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_d0.fStore != (int *)0x0) {
      operator_delete__(local_d0.fStore);
    }
  }
  if ((uint *)local_78.fStore != local_58) {
    local_78.fNAlloc = 0;
    local_78._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if ((uint *)local_78.fStore != (uint *)0x0) {
      operator_delete__(local_78.fStore);
    }
  }
  if (local_a8.fStore != local_88) {
    local_a8.fNAlloc = 0;
    local_a8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_a8.fStore != (long *)0x0) {
      operator_delete__(local_a8.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::InitMaterialData(TPZMaterialData &data){
  data.gelElId = this->Reference()->Id();
    auto *mat =
        dynamic_cast<TPZMatSingleSpace*>(this->Material());
#ifdef PZDEBUG
    if(!mat)
    {
        DebugStop();
    }
#endif
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NSides-TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodeIndex(i);
    for(int i=TSHAPE::NCornerNodes; i<TSHAPE::NSides; i++) orders[i-TSHAPE::NCornerNodes] = this->Connect(i).Order();
    TPZShapeData &shapedata = data;
    TPZShapeH1<TSHAPE>::Initialize(ids, orders, shapedata);
    mat->FillDataRequirements(data);
    const int dim = this->Dimension();
    const int nshape = data.fPhi.Rows();
    const int nstate = this->Material()->NStateVariables();
    data.fShapeType = TPZMaterialData::EScalarShape;
    data.phi.Redim(nshape,1);
//    data.dphi.Redim(dim,nshape);
    data.dphix.Redim(dim,nshape);
    data.axes.Redim(dim,3);
    data.jacobian.Redim(dim,dim);
    data.jacinv.Redim(dim,dim);
    data.x.Resize(3);
    if (data.fNeedsSol){
        uint64_t ulen,durow,ducol;
        mat->GetSolDimensions(ulen,durow,ducol);
        data.SetSolSizes(nstate, ulen, durow, ducol);
    }
    if(data.fNeedsNeighborCenter)
    {
        TPZGeoElSide gelside(gel);
        gelside.CenterX(data.XCenter);
    }
    
}